

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Salsa20.c
# Opt level: O0

void Hacl_Salsa20_salsa20_key_block0(uint8_t *out,uint8_t *key,uint8_t *n)

{
  uint8_t *n_local;
  uint8_t *key_local;
  uint8_t *out_local;
  
  salsa20_key_block0(out,key,n);
  return;
}

Assistant:

void Hacl_Salsa20_salsa20_key_block0(uint8_t *out, uint8_t *key, uint8_t *n)
{
  salsa20_key_block0(out, key, n);
}